

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

string * __thiscall
t_js_generator::js_includes_abi_cxx11_(string *__return_storage_ptr__,t_js_generator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  t_js_generator *local_18;
  t_js_generator *this_local;
  string *result;
  
  local_18 = this;
  this_local = (t_js_generator *)__return_storage_ptr__;
  if ((this->gen_node_ & 1U) == 0) {
    local_b1 = 0;
    std::operator+(&local_d8,
                   "if (typeof Int64 === \'undefined\' && typeof require === \'function\') {\n  ",
                   &this->js_const_type_);
    std::operator+(__return_storage_ptr__,&local_d8,"Int64 = require(\'node-int64\');\n}\n");
    std::__cxx11::string::~string((string *)&local_d8);
  }
  else {
    local_19 = 0;
    std::operator+(&local_60,&this->js_const_type_,"thrift = require(\'thrift\');\n");
    std::operator+(&local_40,&local_60,&this->js_const_type_);
    std::operator+(__return_storage_ptr__,&local_40,"Thrift = thrift.Thrift;\n");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    if ((this->gen_es6_ & 1U) == 0) {
      std::operator+(&local_90,&this->js_const_type_,"Q = thrift.Q;\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    std::operator+(&local_b0,&this->js_const_type_,"Int64 = require(\'node-int64\');\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_js_generator::js_includes() {
  if (gen_node_) {
    string result = js_const_type_ + "thrift = require('thrift');\n"
        + js_const_type_ + "Thrift = thrift.Thrift;\n";
    if (!gen_es6_) {
      result += js_const_type_ + "Q = thrift.Q;\n";
    }
    result += js_const_type_ + "Int64 = require('node-int64');\n";
    return result;
  }
  string result = "if (typeof Int64 === 'undefined' && typeof require === 'function') {\n  " + js_const_type_ + "Int64 = require('node-int64');\n}\n";
  return result;
}